

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O3

void __thiscall cmFindCommon::AddPathSuffix(cmFindCommon *this,string *arg)

{
  pointer pcVar1;
  string suffix;
  value_type local_58;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (arg->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + arg->_M_string_length);
  if (local_58._M_string_length != 0) {
    if (*local_58._M_dataplus._M_p == '/') {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
      std::__cxx11::string::operator=((string *)&local_58,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      if (local_58._M_string_length == 0) goto LAB_00478081;
    }
    if (local_58._M_dataplus._M_p[local_58._M_string_length - 1] == '/') {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
      std::__cxx11::string::operator=((string *)&local_58,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
      if (local_58._M_string_length == 0) goto LAB_00478081;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->SearchPathSuffixes,&local_58);
  }
LAB_00478081:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindCommon::AddPathSuffix(std::string const& arg)
{
  std::string suffix = arg;

  // Strip leading and trailing slashes.
  if (suffix.empty()) {
    return;
  }
  if (suffix[0] == '/') {
    suffix = suffix.substr(1);
  }
  if (suffix.empty()) {
    return;
  }
  if (suffix[suffix.size() - 1] == '/') {
    suffix = suffix.substr(0, suffix.size() - 1);
  }
  if (suffix.empty()) {
    return;
  }

  // Store the suffix.
  this->SearchPathSuffixes.push_back(suffix);
}